

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O2

void __thiscall
test_matrix_dense_matrix_matrix_multiplication_assignment_Test::TestBody
          (test_matrix_dense_matrix_matrix_multiplication_assignment_Test *this)

{
  Vector_Dense<double,_3UL> *this_00;
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  DeathTest DVar6;
  long lVar7;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  DeathTest *gtest_dt;
  size_type sStackY_200;
  undefined8 local_1f8;
  undefined1 local_1e8 [24];
  undefined8 uStack_1d0;
  Matrix_Dense<double,_2UL,_3UL> incorrect;
  Vector_Dense<double,_0UL> local_198;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_0;
  ReturnSentinel gtest_sentinel;
  Matrix_Dense<double,_2UL,_2UL> static_matrix_0;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_1;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_108;
  initializer_list<double> local_f8;
  initializer_list<double> local_e8;
  Matrix_Dense<double,_2UL,_2UL> static_matrix_1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  double local_58 [3];
  initializer_list<double> local_40;
  
  local_1e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_1e8._8_8_ = (pointer)0x4000000000000000;
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] = 9.88131291682493e-324;
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] = (double)local_1e8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)&incorrect,(initializer_list<double> *)&static_matrix_1);
  gtest_dt = (DeathTest *)&dynamic_matrix_1;
  dynamic_matrix_1.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  dynamic_matrix_1.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  sStackY_200 = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)
             (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems + 1),
             (initializer_list<double> *)&gtest_dt);
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] = 9.88131291682493e-324;
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] = (double)&incorrect;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            (&dynamic_matrix_0,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&static_matrix_0);
  lVar7 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                      super_array<double,_3UL>._M_elems + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  local_1e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x4014000000000000;
  local_1e8._8_8_ = (pointer)0x4018000000000000;
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] = 9.88131291682493e-324;
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] = (double)local_1e8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)&incorrect,(initializer_list<double> *)&static_matrix_1);
  gtest_dt = (DeathTest *)&gtest_sentinel;
  gtest_sentinel.test_ = (DeathTest *)0x401c000000000000;
  sStackY_200 = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)
             (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems + 1),
             (initializer_list<double> *)&gtest_dt);
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] = 9.88131291682493e-324;
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] = (double)&incorrect;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            (&dynamic_matrix_1,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&static_matrix_0);
  lVar7 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                      super_array<double,_3UL>._M_elems + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  gtest_dt = (DeathTest *)0x3ff0000000000000;
  sStackY_200 = 0x4000000000000000;
  local_1e8._8_8_ = (pointer)0x2;
  local_1e8._0_8_ = &gtest_dt;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)&incorrect,(initializer_list<double> *)local_1e8);
  gtest_sentinel.test_ = (DeathTest *)&local_108;
  local_108._M_array = (iterator)0x4008000000000000;
  local_108._M_len = 0x4010000000000000;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)
             (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
              super_array<double,_3UL>._M_elems + 2),(initializer_list<double> *)&gtest_sentinel);
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] = 9.88131291682493e-324;
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] = (double)&incorrect;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            (&static_matrix_0,(initializer_list<Disa::Vector_Dense<double,_2UL>_> *)&static_matrix_1
            );
  gtest_sentinel.test_ = (DeathTest *)0x4014000000000000;
  sStackY_200 = 2;
  gtest_dt = (DeathTest *)&gtest_sentinel;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)&incorrect,(initializer_list<double> *)&gtest_dt);
  local_108._M_array = (iterator)&local_f8;
  local_f8._M_array = (iterator)0x401c000000000000;
  local_f8._M_len = 0x4020000000000000;
  local_108._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)
             (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
              super_array<double,_3UL>._M_elems + 2),(initializer_list<double> *)&local_108);
  local_1e8._8_8_ = (pointer)0x2;
  local_1e8._0_8_ = &incorrect;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            (&static_matrix_1,(initializer_list<Disa::Vector_Dense<double,_2UL>_> *)local_1e8);
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&dynamic_matrix_0,&dynamic_matrix_1);
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)&static_matrix_0,&static_matrix_1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][0]","19",
             *((dynamic_matrix_0.
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,19.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][1]","22",
             ((dynamic_matrix_0.
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],22.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][0]","43",
             *dynamic_matrix_0.
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,43.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][1]","50",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],50.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[0][0]","19",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
             super_array<double,_2UL>._M_elems[0],19.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xff,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[0][1]","22",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
             super_array<double,_2UL>._M_elems[1],22.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x100,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[1][0]","43",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
             super_array<double,_2UL>._M_elems[0],43.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x101,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[1][1]","50",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
             super_array<double,_2UL>._M_elems[1],50.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x102,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  local_108._M_array = (iterator)0x3ff0000000000000;
  local_108._M_len = 0x4000000000000000;
  gtest_sentinel.test_ = (DeathTest *)&local_108;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)&incorrect,(initializer_list<double> *)&gtest_sentinel);
  this_00 = incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems + 1;
  local_e8._M_array = (iterator)0x4008000000000000;
  local_e8._M_len = 0x4010000000000000;
  local_f8._M_len = 2;
  local_f8._M_array = (iterator)&local_e8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)this_00,&local_f8);
  sStackY_200 = 2;
  gtest_dt = (DeathTest *)&incorrect;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)local_1e8,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&gtest_dt);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  _M_move_assign(&dynamic_matrix_0.
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ,(vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   *)local_1e8);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           *)local_1e8);
  lVar7 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                      super_array<double,_3UL>._M_elems + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  local_108._M_array = (iterator)0x3ff0000000000000;
  local_108._M_len = 0x4000000000000000;
  gtest_sentinel.test_ = (DeathTest *)&local_108;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1e8,(initializer_list<double> *)&gtest_sentinel);
  local_e8._M_array = (iterator)0x4008000000000000;
  local_e8._M_len = 0x4010000000000000;
  local_f8._M_len = 2;
  local_f8._M_array = (iterator)&local_e8;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)(local_1e8 + 0x10),&local_f8);
  sStackY_200 = 2;
  gtest_dt = (DeathTest *)local_1e8;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            ((Matrix_Dense<double,_2UL,_2UL> *)&incorrect,
             (initializer_list<Disa::Vector_Dense<double,_2UL>_> *)&gtest_dt);
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
  super_array<double,_2UL>._M_elems[0] =
       incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
       super_array<double,_3UL>._M_elems[2];
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
  super_array<double,_2UL>._M_elems[1] =
       incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
       super_array<double,_3UL>._M_elems[0];
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] =
       incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
       super_array<double,_3UL>._M_elems[0];
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] =
       incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
       super_array<double,_3UL>._M_elems[1];
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&dynamic_matrix_0,&static_matrix_1);
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)&static_matrix_0,&dynamic_matrix_1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][0]","19",
             *((dynamic_matrix_0.
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,19.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x109,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][1]","22",
             ((dynamic_matrix_0.
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],22.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][0]","43",
             *dynamic_matrix_0.
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,43.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][1]","50",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],50.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[0][0]","19",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
             super_array<double,_2UL>._M_elems[0],19.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[0][1]","22",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
             super_array<double,_2UL>._M_elems[1],22.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[1][0]","43",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
             super_array<double,_2UL>._M_elems[0],43.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"static_matrix_0[1][1]","50",
             static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
             super_array<double,_2UL>._M_elems[1],50.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x110,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  local_108._M_array = (iterator)0x3ff0000000000000;
  local_108._M_len = 0x4000000000000000;
  gtest_sentinel.test_ = (DeathTest *)&local_108;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)&incorrect,(initializer_list<double> *)&gtest_sentinel);
  local_e8._M_array = (iterator)0x4008000000000000;
  local_e8._M_len = 0x4010000000000000;
  local_f8._M_len = 2;
  local_f8._M_array = (iterator)&local_e8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)this_00,&local_f8);
  local_40._M_array = local_58;
  local_58[0] = 5.0;
  local_58[1] = 6.0;
  local_40._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_198,&local_40);
  sStackY_200 = 3;
  gtest_dt = (DeathTest *)&incorrect;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)local_1e8,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&gtest_dt);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  _M_move_assign(&dynamic_matrix_0.
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ,(vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   *)local_1e8);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           *)local_1e8);
  lVar7 = 0x30;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                      super_array<double,_3UL>._M_elems + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  local_1e8._16_8_ = (pointer)0x4022000000000000;
  uStack_1d0 = 0x4024000000000000;
  local_1e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x401c000000000000;
  local_1e8._8_8_ = (pointer)0x4020000000000000;
  local_f8._M_len = 4;
  local_f8._M_array = (iterator)local_1e8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)&incorrect,&local_f8);
  local_1f8 = 0x402a000000000000;
  pcVar5 = (char *)0x402c000000000000;
  gtest_dt = (DeathTest *)0x4026000000000000;
  sStackY_200 = 0x4028000000000000;
  local_e8._M_len = 4;
  local_e8._M_array = (iterator)&gtest_dt;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)
             (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems + 1),&local_e8);
  local_108._M_len = 2;
  local_108._M_array = (iterator)&incorrect;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&gtest_sentinel,&local_108);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  _M_move_assign(&dynamic_matrix_1.
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ,(vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   *)&gtest_sentinel);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           *)&gtest_sentinel);
  lVar7 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                      super_array<double,_3UL>._M_elems + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&dynamic_matrix_0,&dynamic_matrix_1);
  local_1e8._0_8_ =
       ((long)dynamic_matrix_0.
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&incorrect,"dynamic_matrix_0.size_row()","3",(unsigned_long *)local_1e8,
             (int *)&gtest_dt);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x116,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_1e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  if (dynamic_matrix_0.
      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      .
      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      dynamic_matrix_0.
      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      .
      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8._0_8_ =
         (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          )0x0;
  }
  else {
    local_1e8._0_8_ =
         (long)((dynamic_matrix_0.
                 super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 .
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)((dynamic_matrix_0.
                 super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 .
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start >> 3;
  }
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&incorrect,"dynamic_matrix_0.size_column()","4",(unsigned_long *)local_1e8,
             (int *)&gtest_dt);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x117,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][0]","29",
             *((dynamic_matrix_0.
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,29.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x118,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][1]","32",
             ((dynamic_matrix_0.
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],32.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x119,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][2]","35",
             ((dynamic_matrix_0.
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],35.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[0][3]","38",
             ((dynamic_matrix_0.
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],38.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][0]","65",
             *dynamic_matrix_0.
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,65.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][1]","72",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],72.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][2]","79",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],79.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[1][3]","86",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],86.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[2][0]","101",
             *dynamic_matrix_0.
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,101.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x120,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[2][1]","112",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],112.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x121,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[2][2]","123",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],123.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x122,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&incorrect,"dynamic_matrix_0[2][3]","134",
             dynamic_matrix_0.
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             .
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],134.0);
  if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
      super_array<double,_3UL>._M_elems[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)local_1e8);
    if (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
        super_array<double,_3UL>._M_elems[1] == 0.0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                         super_array<double,_3UL>._M_elems[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x123,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_1e8._0_8_)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].
                    super_array<double,_3UL>._M_elems + 1));
  Disa::Matrix_Dense<double,_0UL,_0UL>::resize(&dynamic_matrix_0,1,1);
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].super_array<double,_3UL>.
  _M_elems[1] = 0.0;
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].super_array<double,_3UL>.
  _M_elems[2] = 0.0;
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].super_array<double,_3UL>.
  _M_elems[2] = 0.0;
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].super_array<double,_3UL>.
  _M_elems[0] = 0.0;
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].super_array<double,_3UL>.
  _M_elems[0] = 0.0;
  incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[0].super_array<double,_3UL>.
  _M_elems[1] = 0.0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar2 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x127,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00113c8e;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)pbVar8)->_vptr_DeathTest[1])(pbVar8);
          goto LAB_00113c8e;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                    ((Matrix_Dense<double,0ul,0ul> *)&dynamic_matrix_1,&incorrect);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar6 = (DeathTest)((DeathTest *)pbVar8)->_vptr_DeathTest;
      goto LAB_00113cd9;
    }
  }
  else {
LAB_00113c8e:
    testing::Message::Message((Message *)local_1e8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_1e8._0_8_;
      pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_1e8._0_8_;
LAB_00113cd9:
      (*DVar6._vptr_DeathTest[1])(pbVar8);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar2 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x128,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00113dd1;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)pbVar8)->_vptr_DeathTest[1])(pbVar8);
          goto LAB_00113dd1;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                    ((Matrix_Dense<double,0ul,0ul> *)&dynamic_matrix_1,&dynamic_matrix_0);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar6 = (DeathTest)((DeathTest *)pbVar8)->_vptr_DeathTest;
      goto LAB_00113e1c;
    }
  }
  else {
LAB_00113dd1:
    testing::Message::Message((Message *)local_1e8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x128,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_1e8._0_8_;
      pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_1e8._0_8_;
LAB_00113e1c:
      (*DVar6._vptr_DeathTest[1])(pbVar8);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar2 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x129,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00113f11;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)pbVar8)->_vptr_DeathTest[1])(pbVar8);
          goto LAB_00113f11;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                    ((Matrix_Dense<double,2ul,2ul> *)&static_matrix_0,&incorrect);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar6 = (DeathTest)((DeathTest *)pbVar8)->_vptr_DeathTest;
      goto LAB_00113f5c;
    }
  }
  else {
LAB_00113f11:
    testing::Message::Message((Message *)local_1e8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x129,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_1e8._0_8_;
      pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_1e8._0_8_;
LAB_00113f5c:
      (*DVar6._vptr_DeathTest[1])(pbVar8);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar2 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x12a,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b8);
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00114054;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_001140a2;
    iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    pDVar1 = gtest_dt;
    if (iVar3 == 0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
      iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (*((DeathTest *)pbVar8)->_vptr_DeathTest[1])(pbVar8);
        goto LAB_00114054;
      }
    }
    else if (iVar3 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                  ((Matrix_Dense<double,2ul,2ul> *)&static_matrix_0,&dynamic_matrix_0);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    DVar6 = (DeathTest)((DeathTest *)pbVar8)->_vptr_DeathTest;
  }
  else {
LAB_00114054:
    testing::Message::Message((Message *)local_1e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x12a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001140a2;
    DVar6._vptr_DeathTest = *(_func_int ***)local_1e8._0_8_;
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_1e8._0_8_;
  }
  (*DVar6._vptr_DeathTest[1])(pbVar8);
LAB_001140a2:
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&dynamic_matrix_1.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&dynamic_matrix_0.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_multiplication_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{5, 6}, {7, 8}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{5, 6}, {7, 8}};

  dynamic_matrix_0 *= dynamic_matrix_1;
  static_matrix_0 *= static_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // reset
  dynamic_matrix_0 = {{1, 2}, {3, 4}};
  static_matrix_0 = {{1, 2}, {3, 4}};
  dynamic_matrix_0 *= static_matrix_1;
  static_matrix_0 *= dynamic_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // non-square
  dynamic_matrix_0 = {{1, 2}, {3, 4}, {5, 6}};
  dynamic_matrix_1 = {{7, 8, 9, 10}, {11, 12, 13, 14}};
  dynamic_matrix_0 *= dynamic_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 3);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 4);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 29);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 32);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][2], 35);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][3], 38);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 65);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 72);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][2], 79);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][3], 86);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][0], 101);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][1], 112);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][2], 123);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][3], 134);

  dynamic_matrix_0.resize(1, 1);
  Matrix_Dense<Scalar, 2, 3> incorrect;
  EXPECT_DEATH(dynamic_matrix_1 *= incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_1 *= dynamic_matrix_0, "./*");
  EXPECT_DEATH(static_matrix_0 *= incorrect, "./*");
  EXPECT_DEATH(static_matrix_0 *= dynamic_matrix_0, "./*");
}